

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heavylight2.cpp
# Opt level: O0

void buildHLD(int v,int c)

{
  int v_00;
  reference pvVar1;
  reference pvVar2;
  size_type sVar3;
  int local_28;
  int local_14;
  int i;
  int c_local;
  int v_local;
  
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&top,(long)v);
  *pvVar1 = c;
  local_14 = 0;
  while( true ) {
    pvVar2 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&G,(long)v);
    sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar2);
    if (sVar3 <= (ulong)(long)local_14) break;
    pvVar2 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&G,(long)v);
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_14);
    v_00 = *pvVar1;
    local_28 = c;
    if (local_14 != 0) {
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&G,(long)v);
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_14);
      local_28 = *pvVar1;
    }
    buildHLD(v_00,local_28);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void buildHLD(int v = 0, int c = 0) {
	top[v] = c;
	rep(i, 0, G[v].size())
		buildHLD(G[v][i], (i) ? G[v][i] : c);
}